

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::executeFileOp(Application *this,int codepoint)

{
  ostream *poVar1;
  stringstream filename;
  char *local_1c0;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if ((this->readyLoad == false) && (this->readyWrite != true)) {
    return;
  }
  if (9 < codepoint - 0x30U) {
    this->readyWrite = false;
    this->readyLoad = false;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Scotty3D_buffer",0xf);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,codepoint - 0x30U);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dae",4);
  if (this->readyWrite == true) {
    std::__cxx11::stringbuf::str();
    writeScene(this,local_1c0);
  }
  else {
    if (this->readyLoad != true) goto LAB_00194bd7;
    std::__cxx11::stringbuf::str();
    loadScene(this,local_1c0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
LAB_00194bd7:
  this->readyWrite = false;
  this->readyLoad = false;
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void Application::executeFileOp(int codepoint) {
  // If the user already pressed 'w' or 'l' (indicating that
  // they wanted to write or load a file) AND the next key
  // they pressed was a number, then we should go ahead and
  // write/load the file corresponding to the specified number.

  if (!readyLoad && !readyWrite) return;

  // Convert Unicode codepoint to integer.  (Probably a more
  // clever way to do this, but often a foolproof solution is
  // (much) better than a clever one...)
  int index = -1;
  switch (codepoint) {
    case '0':
      index = 0;
      break;
    case '1':
      index = 1;
      break;
    case '2':
      index = 2;
      break;
    case '3':
      index = 3;
      break;
    case '4':
      index = 4;
      break;
    case '5':
      index = 5;
      break;
    case '6':
      index = 6;
      break;
    case '7':
      index = 7;
      break;
    case '8':
      index = 8;
      break;
    case '9':
      index = 9;
      break;
    default:
      readyLoad = readyWrite = false;
      return;
      break;
  }

  stringstream filename;
  filename << "Scotty3D_buffer" << index << ".dae";

  if (readyWrite)
    writeScene(filename.str().c_str());
  else if (readyLoad)
    loadScene(filename.str().c_str());

  readyLoad = readyWrite = false;
}